

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O2

void __thiscall LinearScan::SpillInlineeArgs(LinearScan *this,Instr *instr)

{
  uint uVar1;
  Lifetime *spilledRange;
  StackSym *sym;
  code *pcVar2;
  bool bVar3;
  BOOLEAN BVar4;
  uint32 uVar5;
  undefined4 *puVar6;
  Func **ppFVar7;
  int i;
  long lVar8;
  LoweredBasicBlock *pLVar9;
  BVUnitT<unsigned_long> local_48;
  BitVector spilledRegs;
  
  pLVar9 = this->currentBlock;
  spilledRegs.word = (Type)instr;
  if ((pLVar9->inlineeStack).super_ReadOnlyList<Func_*,_Memory::JitArenaAllocator,_DefaultComparer>.
      count < 1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0xd4c,"(this->currentBlock->inlineeStack.Count() > 0)",
                       "this->currentBlock->inlineeStack.Count() > 0");
    if (!bVar3) {
LAB_00534ff2:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
    pLVar9 = this->currentBlock;
  }
  else {
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  }
  ppFVar7 = JsUtil::
            List<Func_*,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
            Last(&pLVar9->inlineeStack);
  *(Func **)(spilledRegs.word + 0x20) = *ppFVar7;
  local_48.word = 0;
  pLVar9 = this->currentBlock;
  lVar8 = 0;
  do {
    if ((pLVar9->inlineeFrameLifetimes).
        super_ReadOnlyList<Lifetime_*,_Memory::JitArenaAllocator,_DefaultComparer>.count <= lVar8) {
      return;
    }
    spilledRange = (pLVar9->inlineeFrameLifetimes).
                   super_ReadOnlyList<Lifetime_*,_Memory::JitArenaAllocator,_DefaultComparer>.buffer
                   [lVar8];
    uVar1 = spilledRange->start;
    uVar5 = IR::Instr::GetNumber((Instr *)spilledRegs.word);
    if (uVar1 < uVar5) {
      uVar1 = spilledRange->end;
      uVar5 = IR::Instr::GetNumber((Instr *)spilledRegs.word);
      if (uVar1 < uVar5) goto LAB_00534d8c;
    }
    else {
LAB_00534d8c:
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                         ,0xd54,
                         "(lifetime->start < instr->GetNumber() && lifetime->end >= instr->GetNumber())"
                         ,
                         "lifetime->start < instr->GetNumber() && lifetime->end >= instr->GetNumber()"
                        );
      if (!bVar3) goto LAB_00534ff2;
      *puVar6 = 0;
    }
    bVar3 = StackSym::IsConst(spilledRange->sym);
    if (bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                         ,0xd55,"(!lifetime->sym->IsConst())","!lifetime->sym->IsConst()");
      if (!bVar3) goto LAB_00534ff2;
      *puVar6 = 0;
    }
    bVar3 = JsUtil::
            BaseDictionary<unsigned_int,_unsigned_int,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::ContainsKey(&this->currentBlock->inlineeFrameSyms,&(spilledRange->sym->super_Sym).m_id
                         );
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                         ,0xd56,
                         "(this->currentBlock->inlineeFrameSyms.ContainsKey(lifetime->sym->m_id))",
                         "this->currentBlock->inlineeFrameSyms.ContainsKey(lifetime->sym->m_id)");
      if (!bVar3) goto LAB_00534ff2;
      *puVar6 = 0;
    }
    if (((spilledRange->reg != RegNOREG) && ((spilledRange->field_0x9c & 0x19) == 0)) &&
       ((sym = spilledRange->sym, (sym->field_0x18 & 1) != 0 ||
        ((SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount> *)
         (spilledRange->defList).super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>.
         super_SListNodeBase<Memory::ArenaAllocator>.next != &spilledRange->defList)))) {
      BVar4 = BVUnitT<unsigned_long>::Test(&local_48,(uint)spilledRange->reg);
      if (BVar4 == '\0') {
        BVUnitT<unsigned_long>::Set(&local_48,(uint)spilledRange->reg);
        if ((sym->field_0x19 & 0x10) == 0) {
          AllocateStackSpace(this,spilledRange);
        }
        RecordLoopUse(this,spilledRange,spilledRange->reg);
        if (this->regContent[spilledRange->reg] == (Lifetime *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar6 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                             ,0xd69,"(this->regContent[lifetime->reg] != nullptr)",
                             "this->regContent[lifetime->reg] != nullptr");
          if (!bVar3) goto LAB_00534ff2;
          *puVar6 = 0;
        }
        if ((sym->field_0x18 & 1) != 0) {
          if ((SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount> *)
              (spilledRange->defList).
              super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>.
              super_SListNodeBase<Memory::ArenaAllocator>.next != &spilledRange->defList) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar6 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                               ,0xd6e,"(lifetime->defList.Empty())","lifetime->defList.Empty()");
            if (!bVar3) goto LAB_00534ff2;
            *puVar6 = 0;
          }
          SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>::Prepend
                    (&spilledRange->defList,&(sym->field_5).m_instrDef);
        }
        InsertStore(this,*(Instr **)(spilledRegs.word + 0x18),sym,spilledRange->reg);
      }
    }
    lVar8 = lVar8 + 1;
  } while( true );
}

Assistant:

void LinearScan::SpillInlineeArgs(IR::Instr* instr)
{
    Assert(this->currentBlock->inlineeStack.Count() > 0);

    // Ensure the call instruction is tied to the current inlinee
    // This is used in the encoder to encode mapping or return offset and InlineeFrameRecord
    instr->m_func = this->currentBlock->inlineeStack.Last();

    BitVector spilledRegs;
    this->currentBlock->inlineeFrameLifetimes.Map([&](uint i, Lifetime* lifetime){
        Assert(lifetime->start < instr->GetNumber() && lifetime->end >= instr->GetNumber());
        Assert(!lifetime->sym->IsConst());
        Assert(this->currentBlock->inlineeFrameSyms.ContainsKey(lifetime->sym->m_id));
        if (lifetime->reg == RegNOREG)
        {
            return;
        }

        StackSym* sym = lifetime->sym;
        if (!lifetime->isSpilled && !lifetime->isOpHelperSpilled &&
            (!lifetime->isDeadStore && (lifetime->sym->m_isSingleDef || !lifetime->defList.Empty()))) // if deflist is empty - we have already spilled at all defs - and the value is current
        {
            if (!spilledRegs.Test(lifetime->reg))
            {
                spilledRegs.Set(lifetime->reg);
                if (!sym->IsAllocated())
                {
                    this->AllocateStackSpace(lifetime);
                }

                this->RecordLoopUse(lifetime, lifetime->reg);
                Assert(this->regContent[lifetime->reg] != nullptr);
                if (sym->m_isSingleDef)
                {
                    // For a single def - we do not track the deflist - the def below will remove the single def on the sym
                    // hence, we need to track the original def.
                    Assert(lifetime->defList.Empty());
                    lifetime->defList.Prepend(sym->m_instrDef);
                }

                this->InsertStore(instr->m_prev, sym, lifetime->reg);
            }
        }
    });
}